

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::CompilerMain(CompilerMain *this,ProcessContext *context)

{
  ProcessContext *context_local;
  CompilerMain *this_local;
  
  GlobalErrorReporter::GlobalErrorReporter(&this->super_GlobalErrorReporter);
  (this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = (_func_int **)&PTR_addError_004c0d40
  ;
  this->context = context;
  kj::newDiskFilesystem();
  ModuleLoader::ModuleLoader(&this->loader,&this->super_GlobalErrorReporter);
  kj::SpaceFor<capnp::compiler::Compiler>::SpaceFor(&this->compilerSpace);
  this->compilerConstructed = false;
  kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::Own(&this->compiler);
  this->annotationFlag = COMPILE_ANNOTATIONS;
  this->compileEagerness = 0x18005;
  kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::HashMap
            (&this->sourceDirectories);
  kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::HashMap(&this->dirPrefixes);
  this->addStandardImportPaths = true;
  this->convertFrom = BINARY;
  this->convertTo = BINARY;
  this->binary = false;
  this->flat = false;
  this->packed = false;
  this->pretty = true;
  this->quiet = false;
  this->segmentSize = 0;
  StructSchema::StructSchema(&this->rootType);
  kj::Vector<capnp::compiler::CompilerMain::SourceFile>::Vector(&this->sourceFiles);
  kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::Vector(&this->outputs);
  this->hadErrors_ = false;
  return;
}

Assistant:

explicit CompilerMain(kj::ProcessContext& context)
      : context(context), disk(kj::newDiskFilesystem()), loader(*this) {}